

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid.h
# Opt level: O3

Range<float,_2> __thiscall Nova::Grid<float,_2>::Cell_Domain(Grid<float,_2> *this,T_INDEX *index)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  float *in_RDI;
  float fVar4;
  float fVar5;
  Range<float,_2> RVar6;
  
  uVar1 = *(undefined8 *)(index->_data)._M_elems;
  uVar2 = *(undefined8 *)(this->domain).min_corner._data._M_elems;
  uVar3 = *(undefined8 *)(this->dX)._data._M_elems;
  fVar4 = (float)uVar3;
  fVar5 = (float)((ulong)uVar3 >> 0x20);
  RVar6.min_corner._data._M_elems[0] = (float)(int)uVar1 * fVar4 + (float)uVar2;
  RVar6.min_corner._data._M_elems[1] =
       (float)(int)((ulong)uVar1 >> 0x20) * fVar5 + (float)((ulong)uVar2 >> 0x20);
  RVar6.max_corner._data._M_elems[0] = RVar6.min_corner._data._M_elems[0] - fVar4;
  RVar6.max_corner._data._M_elems[1] = RVar6.min_corner._data._M_elems[1] - fVar5;
  *in_RDI = RVar6.max_corner._data._M_elems[0];
  in_RDI[1] = RVar6.max_corner._data._M_elems[1];
  in_RDI[2] = RVar6.min_corner._data._M_elems[0];
  in_RDI[3] = RVar6.min_corner._data._M_elems[1];
  return RVar6;
}

Assistant:

Range<T,d> Cell_Domain(const T_INDEX& index) const
    {
        TV corner=domain.min_corner+TV(index)*dX;
        return Range<T,d>(corner-dX,corner);
    }